

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

int Ivy_NodeHasZeroSim(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj)

{
  Ivy_FraigSim_t *pIVar1;
  int local_2c;
  int i;
  Ivy_FraigSim_t *pSims;
  Ivy_Obj_t *pObj_local;
  Ivy_FraigMan_t *p_local;
  
  pIVar1 = Ivy_ObjSim(pObj);
  local_2c = 0;
  while( true ) {
    if (p->nSimWords <= local_2c) {
      return 1;
    }
    if ((&pIVar1[1].Type)[local_2c] != 0) break;
    local_2c = local_2c + 1;
  }
  return 0;
}

Assistant:

int Ivy_NodeHasZeroSim( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj )
{
    Ivy_FraigSim_t * pSims;
    int i;
    pSims = Ivy_ObjSim(pObj);
    for ( i = 0; i < p->nSimWords; i++ )
        if ( pSims->pData[i] )
            return 0;
    return 1;
}